

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O3

void tr_tcp_free(tr_socket *tr_sock)

{
  long lVar1;
  int *ptr;
  tr_tcp_socket *tmp;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = (int *)tr_sock->socket;
  if (ptr == (int *)0x0) {
    __assert_fail("tcp_sock",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/transport/tcp/tcp_transport.c"
                  ,0xee,"void tr_tcp_free(struct tr_socket *)");
  }
  if (*ptr == -1) {
    lrtr_dbg("TCP Transport(%s:%s): Freeing socket",*(undefined8 *)(ptr + 2),
             *(undefined8 *)(ptr + 4));
    lrtr_free(*(void **)(ptr + 2));
    lrtr_free(*(void **)(ptr + 4));
    lrtr_free(*(void **)(ptr + 6));
    if (*(void **)(ptr + 0xe) != (void *)0x0) {
      lrtr_free(*(void **)(ptr + 0xe));
    }
    tr_sock->socket = (void *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      lrtr_free(ptr);
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("tcp_sock->socket == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/transport/tcp/tcp_transport.c"
                ,0xef,"void tr_tcp_free(struct tr_socket *)");
}

Assistant:

void tr_tcp_free(struct tr_socket *tr_sock)
{
	struct tr_tcp_socket *tcp_sock = tr_sock->socket;

	assert(tcp_sock);
	assert(tcp_sock->socket == -1);

	TCP_DBG1("Freeing socket", tcp_sock);

	lrtr_free(tcp_sock->config.host);
	lrtr_free(tcp_sock->config.port);
	lrtr_free(tcp_sock->config.bindaddr);

	if (tcp_sock->ident)
		lrtr_free(tcp_sock->ident);
	tr_sock->socket = NULL;
	lrtr_free(tcp_sock);
}